

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_SetBlend
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  int iVar2;
  AActor *who;
  PClass *pPVar3;
  byte bVar4;
  int iVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  DFlashFader *this;
  uint uVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  char cVar14;
  bool bVar15;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar12 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      who = (AActor *)(param->field_0).field_1.a;
      if (who != (AActor *)0x0) {
        if ((who->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar5 = (**(who->super_DThinker).super_DObject._vptr_DObject)();
          (who->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
        }
        pPVar6 = (who->super_DThinker).super_DObject.Class;
        bVar15 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar3 && bVar15) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar15 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar3) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar15) {
          pcVar12 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d50d6;
        }
      }
      if (numparam == 1) {
        pcVar12 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') {
          if (numparam < 3) {
            pcVar12 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\x01') {
              if (numparam == 3) {
                pcVar12 = "(paramnum) < numparam";
              }
              else {
                if (param[3].field_0.field_3.Type == '\0') {
                  iVar5 = param[1].field_0.i;
                  dVar1 = param[2].field_0.f;
                  iVar2 = param[3].field_0.i;
                  if (numparam < 5) {
                    param = defaultparam->Array;
                    if (param[4].field_0.field_3.Type == '\0') goto LAB_003d4f21;
                    pcVar12 = "(defaultparam[paramnum]).Type == REGT_INT";
                  }
                  else {
                    if (param[4].field_0.field_3.Type == '\0') {
LAB_003d4f21:
                      bVar10 = 0;
                      bVar15 = iVar5 == -1;
                      bVar4 = (byte)((uint)iVar5 >> 0x10);
                      if (bVar15) {
                        bVar4 = bVar10;
                      }
                      uVar7 = param[4].field_0.i;
                      bVar8 = (byte)((uint)iVar5 >> 8);
                      if (bVar15) {
                        bVar8 = bVar10;
                      }
                      bVar9 = (byte)iVar5;
                      if (bVar15) {
                        bVar9 = bVar10;
                      }
                      if (uVar7 == 0xffffffff) {
                        cVar14 = '\0';
                        uVar13 = 0;
                        uVar11 = 0;
                        uVar7 = 0;
                      }
                      else {
                        uVar11 = uVar7 >> 8;
                        uVar13 = uVar7 >> 0x10;
                        cVar14 = (char)(uVar7 >> 0x18);
                      }
                      bVar15 = cVar14 == '\0';
                      uVar13 = uVar13 & 0xff;
                      if (bVar15) {
                        uVar13 = (uint)bVar4;
                      }
                      uVar11 = uVar11 & 0xff;
                      if (bVar15) {
                        uVar11 = (uint)bVar8;
                      }
                      uVar7 = uVar7 & 0xff;
                      if (bVar15) {
                        uVar7 = (uint)bVar9;
                      }
                      this = (DFlashFader *)
                             M_Malloc_Dbg(0x68,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                          ,0x1f9);
                      DFlashFader::DFlashFader
                                (this,(float)bVar4 / 255.0,(float)bVar8 / 255.0,(float)bVar9 / 255.0
                                 ,(float)dVar1,(float)uVar13 / 255.0,(float)uVar11 / 255.0,
                                 (float)uVar7 / 255.0,0.0,(float)iVar2 / 35.0,who);
                      return 0;
                    }
                    pcVar12 = "(param[paramnum]).Type == REGT_INT";
                  }
                  __assert_fail(pcVar12,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0xe5d,
                                "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pcVar12 = "param[paramnum].Type == REGT_INT";
              }
              __assert_fail(pcVar12,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0xe5c,
                            "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar12 = "param[paramnum].Type == REGT_FLOAT";
          }
          __assert_fail(pcVar12,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0xe5b,
                        "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar12 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar12,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xe5a,
                    "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar12 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003d50d6:
  __assert_fail(pcVar12,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xe59,
                "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetBlend)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_COLOR		(color);
	PARAM_FLOAT		(alpha);
	PARAM_INT		(tics);
	PARAM_COLOR_DEF	(color2);

	if (color == MAKEARGB(255,255,255,255))
		color = 0;
	if (color2 == MAKEARGB(255,255,255,255))
		color2 = 0;
	if (color2.a == 0)
		color2 = color;

	new DFlashFader(color.r/255.f, color.g/255.f, color.b/255.f, float(alpha),
					color2.r/255.f, color2.g/255.f, color2.b/255.f, 0,
					float(tics)/TICRATE, self);
	return 0;
}